

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  int iVar1;
  char in_DL;
  undefined1 in_SIL;
  char *in_RDI;
  int nByte;
  undefined4 uVar2;
  undefined2 in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffffc;
  
  uVar2 = 0x20;
  iVar1 = sqlite3VdbeMemClearAndResize
                    ((Mem *)CONCAT17(in_SIL,CONCAT16(in_DL,CONCAT24(in_stack_ffffffffffffffec,0x20))
                                    ),0);
  if (iVar1 == 0) {
    vdbeMemRenderNum(in_stack_fffffffffffffffc,in_RDI,
                     (Mem *)CONCAT17(in_SIL,CONCAT16(in_DL,CONCAT24(in_stack_ffffffffffffffec,uVar2)
                                                    )));
    in_RDI[0x16] = '\x01';
    *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 0x202;
    if (in_DL != '\0') {
      *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) & 0xffd3;
    }
    sqlite3VdbeChangeEncoding
              ((Mem *)CONCAT17(in_SIL,CONCAT16(in_DL,CONCAT24(in_stack_ffffffffffffffec,uVar2))),0);
    iVar1 = 0;
  }
  else {
    in_RDI[0x16] = '\0';
    iVar1 = 7;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  const int nByte = 32;

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(pMem->flags&MEM_Zero) );
  assert( !(pMem->flags&(MEM_Str|MEM_Blob)) );
  assert( pMem->flags&(MEM_Int|MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  vdbeMemRenderNum(nByte, pMem->z, pMem);
  assert( pMem->z!=0 );
  assert( pMem->n==(int)sqlite3Strlen30NN(pMem->z) );
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}